

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O0

void threadFunc(int id,int new_fd,bool *finished,bool *msgFlags,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *msgs,vector<cUser,_std::allocator<cUser>_> *currUsers)

{
  bool bVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  ostream *poVar6;
  void *__buf;
  reference paVar7;
  reference this;
  ssize_t sVar8;
  bool bVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0 [32];
  undefined1 local_380 [8];
  cUser user;
  iterator __end8;
  iterator __begin8;
  vector<cUser,_std::allocator<cUser>_> *__range8;
  anon_class_32_1_0a30e29b_for__M_pred local_338;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_318;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_310;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> local_308;
  const_iterator local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  string local_2b0 [39];
  allocator local_289;
  string local_288 [39];
  allocator local_261;
  string local_260 [39];
  allocator local_239;
  string local_238 [32];
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  string *local_1d0;
  string *cmd_1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [48];
  pollfd local_168;
  pollfd pollData [1];
  string currUser;
  string *local_140;
  string *cmd;
  char buffer [256];
  bool connectionLost;
  bool loginFlag;
  vector<cUser,_std::allocator<cUser>_> *currUsers_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *msgs_local;
  bool *msgFlags_local;
  bool *finished_local;
  int new_fd_local;
  int id_local;
  
  bVar3 = false;
  bVar1 = false;
  std::__cxx11::string::string((string *)pollData);
  local_168.events = 1;
  local_168.fd = new_fd;
  do {
    do {
      while (!bVar3) {
        sVar8 = send(new_fd,"Use Command Login To Login:",0x1c,0);
        if (sVar8 == -1) {
          perror("send");
        }
        local_140 = getCommand_abi_cxx11_(new_fd,&local_168,msgFlags,id);
        if (local_140 == (string *)0x0) {
          poVar6 = std::operator<<((ostream *)&std::cout,"connection with host lost");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          bVar1 = true;
          break;
        }
        std::allocator<char>::allocator();
        cmd_1._7_1_ = 0;
        std::__cxx11::string::string(local_198,"login",&local_199);
        _Var2 = std::operator==(local_140,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_198);
        bVar9 = false;
        if (_Var2) {
          std::__cxx11::string::string(local_1c0,(string *)(local_140 + 0x20));
          cmd_1._7_1_ = 1;
          iVar4 = login((string *)local_1c0,new_fd,(string *)pollData,currUsers,id,msgFlags,msgs);
          bVar9 = iVar4 != 0;
        }
        if ((cmd_1._7_1_ & 1) != 0) {
          std::__cxx11::string::~string(local_1c0);
        }
        std::__cxx11::string::~string(local_198);
        std::allocator<char>::~allocator((allocator<char> *)&local_199);
        if (bVar9) {
          bVar3 = true;
        }
        else {
          send(new_fd,"Server: Denied. Please login first.",0x28,0);
        }
      }
      if (bVar1) {
        if (local_140 != (string *)0x0) {
          psVar5 = local_140 + *(long *)(local_140 + -8) * 0x20;
          while (local_140 != psVar5) {
            psVar5 = psVar5 + -0x20;
            std::__cxx11::string::~string((string *)psVar5);
          }
          operator_delete__(local_140 + -8);
        }
        close(new_fd);
        cmd_1._0_4_ = 1;
LAB_0010e945:
        std::__cxx11::string::~string((string *)pollData);
        return;
      }
    } while (!bVar3);
    psVar5 = getCommand_abi_cxx11_(new_fd,&local_168,msgFlags,id);
    local_1d0 = psVar5;
    if (psVar5 == (string *)0x0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Client connection lost");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      goto LAB_0010e8b1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"newuser",&local_1f1);
    _Var2 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1f0);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    psVar5 = local_1d0;
    if (_Var2) {
      std::__cxx11::string::string(local_218,(string *)(local_1d0 + 0x20));
      newUser((string *)local_218,new_fd);
      std::__cxx11::string::~string(local_218);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,"msg",&local_239);
      _Var2 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_238);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      psVar5 = local_1d0;
      if (_Var2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](msgs,(long)id);
        __buf = (void *)std::__cxx11::string::c_str();
        sVar8 = send(new_fd,__buf,0xff,0);
        if (sVar8 == -1) {
          perror("send error");
        }
        msgFlags[id] = false;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_260,"who",&local_261);
        _Var2 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_260);
        std::__cxx11::string::~string(local_260);
        std::allocator<char>::~allocator((allocator<char> *)&local_261);
        psVar5 = local_1d0;
        if (_Var2) {
          who(currUsers,new_fd);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_288,"send",&local_289);
          _Var2 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_288);
          std::__cxx11::string::~string(local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
          psVar5 = local_1d0;
          if (_Var2) {
            std::__cxx11::string::string(local_2b0,(string *)(local_1d0 + 0x20));
            sendMessage((string *)local_2b0,new_fd,(string *)pollData,currUsers,msgFlags,msgs);
            std::__cxx11::string::~string(local_2b0);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2d0,"logout",&local_2d1);
            _Var2 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_2d0);
            std::__cxx11::string::~string(local_2d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
            if (_Var2) {
              sVar8 = send(new_fd,"You are now loged out",0x19,0);
              if (sVar8 == -1) {
                perror("send");
              }
              std::operator+(local_2f8,(char *)pollData);
              poVar6 = std::operator<<((ostream *)&std::cout,(string *)local_2f8);
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string((string *)local_2f8);
              local_310._M_current =
                   (anon_struct_40_2_6a8bb0e8 *)
                   std::vector<cUser,_std::allocator<cUser>_>::begin(currUsers);
              local_318._M_current =
                   (anon_struct_40_2_6a8bb0e8 *)
                   std::vector<cUser,_std::allocator<cUser>_>::end(currUsers);
              std::__cxx11::string::string((string *)&local_338,(string *)pollData);
              local_308 = std::
                          remove_if<__gnu_cxx::__normal_iterator<cUser*,std::vector<cUser,std::allocator<cUser>>>,threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                    (local_310,local_318,&local_338);
              __gnu_cxx::__normal_iterator<cUser_const*,std::vector<cUser,std::allocator<cUser>>>::
              __normal_iterator<cUser*>
                        ((__normal_iterator<cUser_const*,std::vector<cUser,std::allocator<cUser>>> *
                         )&local_300,&local_308);
              std::vector<cUser,_std::allocator<cUser>_>::erase(currUsers,local_300);
              threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)
              ::$_0::~__0((__0 *)&local_338);
              __end8 = std::vector<cUser,_std::allocator<cUser>_>::begin(currUsers);
              user._32_8_ = std::vector<cUser,_std::allocator<cUser>_>::end(currUsers);
              while (bVar3 = __gnu_cxx::operator!=
                                       (&__end8,(__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>
                                                 *)&user.id), bVar3) {
                paVar7 = __gnu_cxx::
                         __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>::
                         operator*(&__end8);
                anon_struct_40_2_6a8bb0e8::cUser((anon_struct_40_2_6a8bb0e8 *)local_380,paVar7);
                std::operator+(local_3a0,(char *)pollData);
                this = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](msgs,(long)(int)user._24_4_);
                std::__cxx11::string::operator=((string *)this,(string *)local_3a0);
                std::__cxx11::string::~string((string *)local_3a0);
                msgFlags[(int)user._24_4_] = true;
                anon_struct_40_2_6a8bb0e8::~cUser((anon_struct_40_2_6a8bb0e8 *)local_380);
                __gnu_cxx::__normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_>::
                operator++(&__end8);
              }
LAB_0010e8b1:
              if (local_140 != (string *)0x0) {
                psVar5 = local_140 + *(long *)(local_140 + -8) * 0x20;
                while (local_140 != psVar5) {
                  psVar5 = psVar5 + -0x20;
                  std::__cxx11::string::~string((string *)psVar5);
                }
                operator_delete__(local_140 + -8);
              }
              close(new_fd);
              cmd_1._0_4_ = 0;
              goto LAB_0010e945;
            }
            sVar8 = send(new_fd,"Invalid Command",0x14,0);
            if (sVar8 == -1) {
              perror("send");
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

void threadFunc(int id,int new_fd, bool* finished,
    bool* msgFlags, vector<string>& msgs, vector<cUser>& currUsers){

    //needed flags for user flow
    bool loginFlag = false;
    bool connectionLost = false;
    char buffer[MAXDATASIZE];
    string* cmd;
    string currUser;
    struct pollfd pollData[1];

    //set up the polling data for the sockets function
    pollData[0].fd = new_fd;
    pollData[0].events = POLLIN;


    while(1){
        //don't let anyone past unless they got that login
        while(!loginFlag){

            //Send login notice
            if (send(new_fd, "Use Command Login To Login:", 28, 0) == -1)
                perror("send");

            //get the users command
            cmd = getCommand(new_fd,pollData,msgFlags,id);

            //if the getCommand function returns null it means connection was lost
            if(cmd == NULL){
                cout << "connection with host lost" << endl;
                connectionLost = true;
                break;
            }

            //if they are all logged in set it all up
            if(cmd[0] == string("login") && login(cmd[1],new_fd,&currUser,currUsers,id, msgFlags, msgs)){
                //add the user to the current users list
                loginFlag = true;
            }
            else{
                send(new_fd, "Server: Denied. Please login first.", 40, 0);
            }
        }

        //make sure connection isn't lost during logins
        if(connectionLost){
            delete[] cmd;
            close(new_fd);
            return;
        }
        //start looping through recieving and sending messages
        if(loginFlag){
            string* cmd = getCommand(new_fd,pollData,msgFlags,id);

            //connection to the socket was lost
            if(cmd == NULL){
                cout << "Client connection lost" << endl;
                break;
            }


            //user flow to activate functions for each command
            if(cmd[0] == string("newuser")){
                newUser(cmd[1],new_fd);
            }
            else if(cmd[0] == string("msg")){
                if(send(new_fd,msgs[id].c_str(),MAXDATASIZE-1,0) == -1)
                    perror("send error");
                msgFlags[id] = false;
            }
            else if (cmd[0] == string("who")){
                who(currUsers,new_fd);
            }
            else if (cmd[0] == string("send")){
                sendMessage(cmd[1], new_fd, currUser, currUsers, msgFlags, msgs);
            }
            else if (cmd[0] == string("logout")){
                if (send(new_fd, "You are now loged out", 25, 0) == -1)
                    perror("send");

                loginFlag = false;

                cout << currUser + " logout." << endl;

                //remove the user from the list of current users
                currUsers.erase(remove_if(currUsers.begin(), currUsers.end(),[currUser](cUser u){
                    return (u.username == currUser);
                }));

                //broadcast the user has joined
                for(cUser user : currUsers){
                    msgs[user.id] = string(currUser + " left");
                    msgFlags[user.id] = true;
                }

                break;

            }
            //catch any other invalid input
            else {
                if(send((new_fd),"Invalid Command",20,0) == -1)
                    perror("send");
            }
        }
    }
    //final clean up
    delete[] cmd;
    close(new_fd);
}